

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O1

exr_result_t
exr_attr_set_channels(exr_context_t ctxt,int part_index,char *name,exr_attr_chlist_t *channels)

{
  pthread_mutex_t *__mutex;
  exr_priv_part_t p_Var1;
  exr_attr_chlist_entry_t *peVar2;
  exr_attr_chlist_t *peVar3;
  int iVar4;
  uint uVar5;
  exr_result_t eVar6;
  long lVar7;
  ulong uVar8;
  uint nchans;
  ulong uVar9;
  exr_attribute_list_t *list;
  long lVar10;
  exr_context_t nonc;
  bool bVar11;
  exr_attribute_t *attr;
  ulong local_58;
  ulong local_50;
  exr_attr_chlist_t *local_48;
  exr_attr_chlist_t clist;
  
  attr = (exr_attribute_t *)0x0;
  if (ctxt == (exr_context_t)0x0) {
    uVar5 = 2;
  }
  else {
    __mutex = &ctxt->mutex;
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if ((part_index < 0) || (ctxt->num_parts <= part_index)) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      eVar6 = (*ctxt->print_error)
                        (ctxt,4,"Part index (%d) out of range",(ulong)(uint)part_index,
                         ctxt->print_error);
      return eVar6;
    }
    p_Var1 = ctxt->parts[(uint)part_index];
    if ((name != (char *)0x0) && (iVar4 = strcmp(name,"channels"), iVar4 == 0)) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      eVar6 = exr_set_channels(ctxt,part_index,channels);
      return eVar6;
    }
    if ((ctxt->mode != '\x01') && (ctxt->mode != '\x04')) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      eVar6 = (*ctxt->standard_error)(ctxt,8);
      return eVar6;
    }
    if (channels == (exr_attr_chlist_t *)0x0) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      eVar6 = (*ctxt->print_error)
                        (ctxt,3,"No input values for setting \'%s\', type \'chlist\'",name,
                         ctxt->print_error);
      return eVar6;
    }
    list = &p_Var1->attributes;
    uVar5 = exr_attr_list_find_by_name(ctxt,list,name,&attr);
    if (uVar5 == 0xf) {
      uVar5 = exr_attr_list_add(ctxt,list,name,EXR_ATTR_CHLIST,0,(uint8_t **)0x0,&attr);
    }
    if (uVar5 == 0) {
      nchans = channels->num_channels;
      uVar5 = exr_attr_chlist_init(ctxt,&clist,nchans);
      if (uVar5 == 0) {
        bVar11 = 0 < (int)nchans;
        if ((int)nchans < 1) {
          uVar5 = 0;
        }
        else {
          uVar9 = -(ulong)nchans;
          lVar10 = 0x1c;
          uVar8 = 1;
          local_58 = uVar9;
          local_50 = (ulong)nchans;
          local_48 = channels;
          do {
            peVar2 = local_48->entries;
            uVar5 = exr_attr_chlist_add_with_length
                              (ctxt,&clist,*(char **)(peVar2->reserved + lVar10 + -0x29),
                               *(int32_t *)(peVar2->reserved + lVar10 + -0x31),
                               *(exr_pixel_type_t *)(peVar2->reserved + lVar10 + -0x21),
                               (uint)peVar2->reserved[lVar10 + -0x1d],
                               *(int32_t *)(peVar2->reserved + lVar10 + -0x19),
                               *(int32_t *)(peVar2->reserved + lVar10 + -0x15));
            if (uVar5 != 0) {
              uVar9 = (ulong)uVar5;
              exr_attr_chlist_destroy(ctxt,&clist);
              pthread_mutex_unlock((pthread_mutex_t *)__mutex);
            }
            nchans = (uint)uVar9;
            if (uVar5 != 0) break;
            bVar11 = uVar8 < local_50;
            lVar10 = lVar10 + 0x20;
            lVar7 = local_58 + uVar8;
            uVar8 = uVar8 + 1;
          } while (lVar7 != 0);
        }
        if (bVar11) {
          bVar11 = false;
        }
        else {
          exr_attr_chlist_destroy(ctxt,(attr->field_6).chlist);
          peVar3 = (attr->field_6).chlist;
          peVar3->num_channels = clist.num_channels;
          peVar3->num_alloced = clist.num_alloced;
          peVar3->entries = clist.entries;
          bVar11 = true;
        }
      }
      else {
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        bVar11 = false;
        nchans = uVar5;
      }
      if (!bVar11) {
        return nchans;
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  return uVar5;
}

Assistant:

exr_result_t
exr_attr_set_channels (
    exr_context_t            ctxt,
    int                      part_index,
    const char*              name,
    const exr_attr_chlist_t* channels)
{
    exr_attribute_t* attr = NULL;
    exr_result_t     rv   = EXR_ERR_SUCCESS;

    EXR_LOCK_AND_DEFINE_PART (part_index);

    if (name && 0 == strcmp (name, EXR_REQ_CHANNELS_STR))
        return EXR_UNLOCK_AND_RETURN (
            exr_set_channels (ctxt, part_index, channels));

    /* do not support updating channels during update operation... */
    if (ctxt->mode != EXR_CONTEXT_WRITE && ctxt->mode != EXR_CONTEXT_TEMPORARY)
        return EXR_UNLOCK_AND_RETURN (
            ctxt->standard_error (ctxt, EXR_ERR_NOT_OPEN_WRITE));

    if (!channels)
        return EXR_UNLOCK_AND_RETURN (ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "No input values for setting '%s', type 'chlist'",
            name));

    rv = exr_attr_list_find_by_name (
        ctxt, (exr_attribute_list_t*) &(part->attributes), name, &attr);

    if (rv == EXR_ERR_NO_ATTR_BY_NAME)
    {
        rv = exr_attr_list_add (
            ctxt, &(part->attributes), name, EXR_ATTR_CHLIST, 0, NULL, &(attr));
    }

    if (rv == EXR_ERR_SUCCESS)
    {
        exr_attr_chlist_t clist;
        int               numchans;

        if (!channels)
            return EXR_UNLOCK_AND_RETURN (ctxt->report_error (
                ctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "No channels provided for channel list"));

        numchans = channels->num_channels;
        rv       = exr_attr_chlist_init (ctxt, &clist, numchans);
        if (rv != EXR_ERR_SUCCESS) return EXR_UNLOCK_AND_RETURN (rv);

        for (int c = 0; c < numchans; ++c)
        {
            const exr_attr_chlist_entry_t* cur = channels->entries + c;

            rv = exr_attr_chlist_add_with_length (
                ctxt,
                &clist,
                cur->name.str,
                cur->name.length,
                cur->pixel_type,
                cur->p_linear,
                cur->x_sampling,
                cur->y_sampling);
            if (rv != EXR_ERR_SUCCESS)
            {
                exr_attr_chlist_destroy (ctxt, &clist);
                return EXR_UNLOCK_AND_RETURN (rv);
            }
        }

        exr_attr_chlist_destroy (ctxt, attr->chlist);
        *(attr->chlist) = clist;
    }
    return EXR_UNLOCK_AND_RETURN (rv);
}